

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O3

void testTinySVD_3x3<double>(Matrix33<double> *A)

{
  bool bVar1;
  ostream *poVar2;
  double (*padVar3) [3];
  int i;
  long lVar4;
  int j;
  long lVar5;
  int cols [3];
  Matrix33<double> B;
  int local_88 [4];
  double local_78;
  double local_70;
  double dStack_68;
  double local_60;
  double local_58;
  double local_50;
  double dStack_48;
  double local_40;
  double local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Verifying SVD for [[",0x14);
  poVar2 = std::ostream::_M_insert<double>(A->x[0][0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>(A->x[0][1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>(A->x[0][2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"], ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[",1);
  poVar2 = std::ostream::_M_insert<double>(A->x[1][0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>(A->x[1][1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>(A->x[1][2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"], ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[",1);
  poVar2 = std::ostream::_M_insert<double>(A->x[2][0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>(A->x[2][1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>(A->x[2][2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]]\n",3);
  verifyTinySVD_3x3<double>(A);
  local_70 = A->x[1][0];
  dStack_68 = A->x[2][0];
  local_78 = A->x[0][0];
  local_60 = A->x[0][1];
  local_58 = A->x[1][1];
  local_50 = A->x[2][1];
  dStack_48 = A->x[0][2];
  local_40 = A->x[1][2];
  local_38 = A->x[2][2];
  verifyTinySVD_3x3<double>((Matrix33<double> *)&local_78);
  local_88[0] = 0;
  local_88[1] = 1;
  local_88[2] = 2;
  do {
    local_78 = 1.0;
    local_60 = 0.0;
    local_70 = 0.0;
    dStack_68 = 0.0;
    local_58 = 1.0;
    local_40 = 0.0;
    local_50 = 0.0;
    dStack_48 = 0.0;
    local_38 = 1.0;
    lVar4 = 0;
    padVar3 = (double (*) [3])&local_78;
    do {
      lVar5 = 0;
      do {
        (*(double (*) [3])*padVar3)[lVar5] = A->x[lVar4][local_88[lVar5]];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar4 = lVar4 + 1;
      padVar3 = padVar3 + 1;
    } while (lVar4 != 3);
    verifyTinySVD_3x3<double>((Matrix33<double> *)&local_78);
    bVar1 = std::__next_permutation<int*,__gnu_cxx::__ops::_Iter_less_iter>(local_88);
  } while (bVar1);
  return;
}

Assistant:

void
testTinySVD_3x3 (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A)
{
    std::cout << "Verifying SVD for [[" << A[0][0] << ", " << A[0][1] << ", "
              << A[0][2] << "], "
              << "[" << A[1][0] << ", " << A[1][1] << ", " << A[1][2] << "], "
              << "[" << A[2][0] << ", " << A[2][1] << ", " << A[2][2] << "]]\n";

    verifyTinySVD_3x3 (A);
    verifyTinySVD_3x3 (A.transposed ());

    // Try all different orderings of the columns of A:
    int cols[3] = {0, 1, 2};
    do
    {
        IMATH_INTERNAL_NAMESPACE::Matrix33<T> B;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                B[i][j] = A[i][cols[j]];

        verifyTinySVD_3x3 (B);
    } while (std::next_permutation (cols, cols + 3));
}